

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0091(SemanticModelTester *this)

{
  Symbol *pSVar1;
  DeclarationCategory DVar2;
  SymbolKind SVar3;
  bool bVar4;
  TypeKind TVar5;
  BasicTypeKind BVar6;
  int iVar7;
  undefined4 extraout_var;
  Lexeme *pLVar8;
  Type *pTVar9;
  undefined4 extraout_var_00;
  FunctionDeclarationSymbol *this_01;
  undefined4 extraout_var_02;
  undefined8 uVar10;
  ostream *poVar11;
  ostream *poVar12;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_> syms
  ;
  SemanticModel *local_28;
  VariableAndOrFunctionDeclarationSyntax *local_20;
  ObjectDeclarationSymbol *this_00;
  undefined4 extraout_var_01;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"int x , y ( int z ) ;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&syms,"",&local_6a);
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd8,(string *)this,&local_68);
  std::__cxx11::string::~string((string *)&syms);
  std::__cxx11::string::~string((string *)&local_68);
  SemanticModel::variablesAndOrFunctionsFor(&syms,local_28,local_20);
  if ((long)syms.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)syms.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,2);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xe9);
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  pSVar1 = &(*syms.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_Symbol;
  if (pSVar1 == (Symbol *)0x0) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
    poVar11 = std::operator<<(poVar11,"true");
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar12 = (ostream *)std::operator<<(poVar11,":");
    iVar7 = 0xec;
LAB_00388c23:
    poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar7);
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
  if (DVar2 != Object) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
    DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
    poVar11 = C::operator<<(poVar11,DVar2);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
    poVar11 = std::operator<<(poVar11,"Object");
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar12 = (ostream *)std::operator<<(poVar11,":");
    iVar7 = 0xed;
    goto LAB_00388c23;
  }
  SVar3 = Symbol::kind(pSVar1);
  if (SVar3 != VariableDeclaration) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
    SVar3 = Symbol::kind(pSVar1);
    poVar11 = C::operator<<(poVar11,SVar3);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
    poVar11 = std::operator<<(poVar11,"VariableDeclaration");
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar12 = (ostream *)std::operator<<(poVar11,":");
    iVar7 = 0xee;
    goto LAB_00388c23;
  }
  iVar7 = (*pSVar1->_vptr_Symbol[0xd])(pSVar1);
  this_00 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar7);
  pLVar8 = &ObjectDeclarationSymbol::name(this_00)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
  bVar4 = std::operator==(&local_68,"x");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar4) {
    pTVar9 = ObjectDeclarationSymbol::type(this_00);
    TVar5 = Type::kind(pTVar9);
    if (TVar5 == Basic) {
      pTVar9 = ObjectDeclarationSymbol::type(this_00);
      iVar7 = (*pTVar9->_vptr_Type[5])(pTVar9);
      BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar7));
      if (BVar6 == Int_S) {
        pSVar1 = &syms.
                  super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->super_Symbol;
        if (pSVar1 == (Symbol *)0x0) {
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
          poVar11 = std::operator<<(poVar11,"true");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar12 = (ostream *)std::operator<<(poVar11,":");
          iVar7 = 0xf5;
LAB_0038907b:
          poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar7);
          std::endl<char,std::char_traits<char>>(poVar11);
          uVar10 = __cxa_allocate_exception(1);
          __cxa_throw(uVar10,&TestFailed::typeinfo,0);
        }
        DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
        if (DVar2 != Function) {
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
          DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
          poVar11 = C::operator<<(poVar11,DVar2);
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
          poVar11 = std::operator<<(poVar11,"Function");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar12 = (ostream *)std::operator<<(poVar11,":");
          iVar7 = 0xf6;
          goto LAB_0038907b;
        }
        SVar3 = Symbol::kind(pSVar1);
        if (SVar3 != FunctionDeclaration) {
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
          SVar3 = Symbol::kind(pSVar1);
          poVar11 = C::operator<<(poVar11,SVar3);
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
          poVar11 = std::operator<<(poVar11,"FunctionDeclaration");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar12 = (ostream *)std::operator<<(poVar11,":");
          iVar7 = 0xf7;
          goto LAB_0038907b;
        }
        iVar7 = (*pSVar1->_vptr_Symbol[9])(pSVar1);
        this_01 = (FunctionDeclarationSymbol *)CONCAT44(extraout_var_01,iVar7);
        if (this_01 == (FunctionDeclarationSymbol *)0x0) {
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
          poVar11 = std::operator<<(poVar11,"true");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar12 = (ostream *)std::operator<<(poVar11,":");
          iVar7 = 0xf9;
        }
        else {
          pLVar8 = &FunctionDeclarationSymbol::name(this_01)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
          bVar4 = std::operator==(&local_68,"y");
          std::__cxx11::string::~string((string *)&local_68);
          if (!bVar4) {
            poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
            pLVar8 = &FunctionDeclarationSymbol::name(this_01)->super_Lexeme;
            Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
            poVar11 = std::operator<<(poVar11,(string *)&local_68);
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
            poVar11 = std::operator<<(poVar11,"y");
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"\t\t");
            poVar11 = std::operator<<(poVar11,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar11 = std::operator<<(poVar11,":");
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xfa);
            std::endl<char,std::char_traits<char>>(poVar11);
            std::__cxx11::string::~string((string *)&local_68);
            goto LAB_0038927c;
          }
          pTVar9 = FunctionDeclarationSymbol::type(this_01);
          TVar5 = Type::kind(pTVar9);
          if (TVar5 == Function) {
            std::
            _Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ::~_Vector_base(&syms.
                             super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                           );
            return;
          }
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
          pTVar9 = FunctionDeclarationSymbol::type(this_01);
          TVar5 = Type::kind(pTVar9);
          poVar11 = ::operator<<(poVar11,TVar5);
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
          poVar11 = std::operator<<(poVar11,"Function");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar12 = (ostream *)std::operator<<(poVar11,":");
          iVar7 = 0xfb;
        }
        poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar7);
        std::endl<char,std::char_traits<char>>(poVar11);
LAB_0038927c:
        uVar10 = __cxa_allocate_exception(1);
        __cxa_throw(uVar10,&TestFailed::typeinfo,0);
      }
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      pTVar9 = ObjectDeclarationSymbol::type(this_00);
      iVar7 = (*pTVar9->_vptr_Type[5])(pTVar9);
      BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar7));
      poVar11 = C::operator<<(poVar11,BVar6);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"signed int");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar12 = (ostream *)std::operator<<(poVar11,":");
      iVar7 = 0xf2;
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      pTVar9 = ObjectDeclarationSymbol::type(this_00);
      TVar5 = Type::kind(pTVar9);
      poVar11 = ::operator<<(poVar11,TVar5);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"Basic");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar12 = (ostream *)std::operator<<(poVar11,":");
      iVar7 = 0xf1;
    }
    poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar7);
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
    pLVar8 = &ObjectDeclarationSymbol::name(this_00)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
    poVar11 = std::operator<<(poVar11,(string *)&local_68);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
    poVar11 = std::operator<<(poVar11,"x");
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xf0);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&local_68);
  }
  uVar10 = __cxa_allocate_exception(1);
  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0091()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("int x , y ( int z ) ;");

    auto syms = semaModel->variablesAndOrFunctionsFor(varAndOrFunDeclNode);
    PSY_EXPECT_EQ_INT(syms.size(), 2);

    const DeclarationSymbol* declSym0 = syms[0];
    PSY_EXPECT_TRUE(declSym0);
    PSY_EXPECT_EQ_ENU(declSym0->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym0->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym0 = declSym0->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym0->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(varDeclSym0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(varDeclSym0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    const DeclarationSymbol* declSym1 = syms[1];
    PSY_EXPECT_TRUE(declSym1);
    PSY_EXPECT_EQ_ENU(declSym1->category(), DeclarationCategory::Function, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym1->kind(), SymbolKind::FunctionDeclaration, SymbolKind);
    const FunctionDeclarationSymbol* funcDeclSym1 = declSym1->asFunctionDeclaration();
    PSY_EXPECT_TRUE(funcDeclSym1);
    PSY_EXPECT_EQ_STR(funcDeclSym1->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(funcDeclSym1->type()->kind(), TypeKind::Function, TypeKind);
}